

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperUtils.c
# Opt level: O2

float Map_MappingComputeDelayWithFanouts(Map_Man_t *p)

{
  Map_Node_t *p_00;
  int iVar1;
  long lVar2;
  float fVar3;
  
  for (lVar2 = 0; lVar2 < p->vMapObjs->nSize; lVar2 = lVar2 + 1) {
    p_00 = p->vMapObjs->pArray[lVar2];
    iVar1 = Map_NodeIsAnd(p_00);
    if ((iVar1 != 0) && (p_00->pRepr == (Map_Node_t *)0x0)) {
      if (0 < p_00->nRefAct[0]) {
        Map_TimeCutComputeArrival(p_00,p_00->pCutBest[0],0,3.4028235e+37);
      }
      if (0 < p_00->nRefAct[1]) {
        Map_TimeCutComputeArrival(p_00,p_00->pCutBest[1],1,3.4028235e+37);
      }
    }
  }
  fVar3 = Map_TimeComputeArrivalMax(p);
  printf("Max arrival times with fanouts = %10.2f.\n",(double)fVar3);
  return fVar3;
}

Assistant:

float Map_MappingComputeDelayWithFanouts( Map_Man_t * p )
{
    Map_Node_t * pNode;
    float Result;
    int i;
    for ( i = 0; i < p->vMapObjs->nSize; i++ )
    {
        // skip primary inputs
        pNode = p->vMapObjs->pArray[i];
        if ( !Map_NodeIsAnd( pNode ) )
            continue;
        // skip a secondary node
        if ( pNode->pRepr )
            continue;
        // count the switching nodes
        if ( pNode->nRefAct[0] > 0 )
            Map_TimeCutComputeArrival( pNode, pNode->pCutBest[0], 0, MAP_FLOAT_LARGE );
        if ( pNode->nRefAct[1] > 0 )
            Map_TimeCutComputeArrival( pNode, pNode->pCutBest[1], 1, MAP_FLOAT_LARGE );
    }
    Result = Map_TimeComputeArrivalMax(p);
    printf( "Max arrival times with fanouts = %10.2f.\n", Result );
    return Result;
}